

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<unsigned_long>
          (BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,unsigned_long *key,SourceContextInfo **value)

{
  int *piVar1;
  uint uVar2;
  SimpleDictionaryEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_> *pSVar3;
  uint uVar4;
  
  piVar1 = (this->buckets).ptr;
  uVar2 = 0;
  if (piVar1 != (int *)0x0) {
    uVar2 = GetBucket(((uint)(*key >> 0x20) ^ (uint)*key) * 2 + 1,this->bucketCount,
                      this->modFunctionIndex);
    uVar4 = piVar1[uVar2];
    uVar2 = 0;
    if (-1 < (int)uVar4) {
      pSVar3 = (this->entries).ptr;
      uVar2 = 0;
      do {
        if (pSVar3[uVar4].
            super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>.
            super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
            .
            super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
            .key == *key) {
          if (this->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(this->stats,uVar2);
            pSVar3 = (this->entries).ptr;
          }
          *value = pSVar3[uVar4].
                   super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>.
                   super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
                   .
                   super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                   .value.ptr;
          return true;
        }
        uVar2 = uVar2 + 1;
        uVar4 = pSVar3[uVar4].
                super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>.
                super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
                .
                super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
                .next;
      } while (-1 < (int)uVar4);
    }
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,uVar2);
  }
  return false;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }